

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void LTAircraft::CameraRegisterCommands(bool bRegister)

{
  byte in_DIL;
  int i;
  undefined8 local_8;
  
  local_8._4_4_ = (uint)(((ulong)in_DIL << 0x38) >> 0x20) & 0x1ffffff;
  local_8 = (ulong)local_8._4_4_ << 0x20;
  while ((int)local_8 < 0x20) {
    if (dataRefs.cmdXP[(int)local_8] != (XPLMCommandRef)0x0) {
      if ((local_8 & 0x100000000000000) == 0) {
        XPLMUnregisterCommandHandler
                  (dataRefs.cmdXP[(int)local_8],CameraCommandsCB,0,(long)(int)local_8);
      }
      else {
        XPLMRegisterCommandHandler
                  (dataRefs.cmdXP[(int)local_8],CameraCommandsCB,0,(long)(int)local_8);
      }
    }
    local_8 = CONCAT44(local_8._4_4_,(int)local_8 + 1);
  }
  return;
}

Assistant:

void LTAircraft::CameraRegisterCommands(bool bRegister)
{
    // first time init?
    for (int i = CR_GENERAL_LEFT; i <= CR_GENERAL_ZOOM_OUT_FAST; i++) {
        if (dataRefs.cmdXP[i]) {
            if (bRegister)
                XPLMRegisterCommandHandler(dataRefs.cmdXP[i], CameraCommandsCB, 0, (void*)(long long)i);
            else
                XPLMUnregisterCommandHandler(dataRefs.cmdXP[i], CameraCommandsCB, 0, (void*)(long long)i);
        }
    }
}